

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

void __thiscall duckdb_re2::DFA::RWLocker::~RWLocker(RWLocker *this)

{
  bool bVar1;
  int iVar2;
  runtime_error *this_00;
  
  bVar1 = this->writing_;
  iVar2 = pthread_rwlock_unlock((pthread_rwlock_t *)this->mu_);
  if (bVar1 == false) {
    if (iVar2 == 0) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"RE2 pthread failure");
  }
  else {
    if (iVar2 == 0) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"RE2 pthread failure");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

DFA::RWLocker::~RWLocker() {
  if (!writing_)
    mu_->ReaderUnlock();
  else
    mu_->WriterUnlock();
}